

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::GenerateAddFileToPool
               (FileDescriptor *file,bool is_descriptor,Printer *printer)

{
  long lVar1;
  size_t __n;
  undefined8 *puVar2;
  void *pvVar3;
  size_type __n_00;
  int iVar4;
  FileDescriptor *pFVar5;
  FileDescriptorProto *proto;
  undefined1 is_descriptor_00;
  string *in_RCX;
  Rep *pRVar6;
  void **ppvVar7;
  void **ppvVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  undefined7 in_register_00000031;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int num;
  char *__end;
  bool bVar15;
  FileDescriptorSet files;
  string files_data;
  FileDescriptorSet local_e8;
  string local_b8;
  RepeatedPtrFieldBase *local_98;
  pointer local_90;
  FileDescriptorProto *local_88;
  void **local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  io::Printer::Print<>
            (printer,
             "public static $is_initialized = false;\n\npublic static function initOnce() {\n");
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print<>
            (printer,
             "$pool = \\Google\\Protobuf\\Internal\\DescriptorPool::getGeneratedPool();\n\nif (static::$is_initialized == true) {\n  return;\n}\n"
            );
  if ((int)CONCAT71(in_register_00000031,is_descriptor) != 0) {
    if (0 < *(int *)(file + 0x2c)) {
      lVar13 = 0;
      lVar10 = 0;
      do {
        local_e8.super_Message.super_MessageLite._vptr_MessageLite =
             (MessageLite)(MessageLite)&local_e8._has_bits_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"","");
        GenerateMessageToPool
                  ((string *)&local_e8,(Descriptor *)(*(long *)(file + 0x68) + lVar13),printer);
        if (local_e8.super_Message.super_MessageLite._vptr_MessageLite !=
            (MessageLite)&local_e8._has_bits_) {
          operator_delete((void *)local_e8.super_Message.super_MessageLite._vptr_MessageLite);
        }
        lVar10 = lVar10 + 1;
        lVar13 = lVar13 + 0x90;
      } while (lVar10 < *(int *)(file + 0x2c));
    }
    if (0 < *(int *)(file + 0x30)) {
      lVar10 = 0;
      lVar13 = 0;
      do {
        GenerateEnumToPool((EnumDescriptor *)(*(long *)(file + 0x70) + lVar10),printer);
        lVar13 = lVar13 + 1;
        lVar10 = lVar10 + 0x50;
      } while (lVar13 < *(int *)(file + 0x30));
    }
    io::Printer::Print<>(printer,"$pool->finish();\n");
    goto LAB_0026e5c0;
  }
  if (0 < *(int *)(file + 0x20)) {
    iVar9 = 0;
    do {
      pFVar5 = FileDescriptor::dependency(file,iVar9);
      is_descriptor_00 = SUB81(in_RCX,0);
      __n = (*(undefined8 **)pFVar5)[1];
      if (__n == kDescriptorFile_abi_cxx11_._M_string_length) {
        if (__n != 0) {
          iVar4 = bcmp((void *)**(undefined8 **)pFVar5,kDescriptorFile_abi_cxx11_._M_dataplus._M_p,
                       __n);
          is_descriptor_00 = SUB81(in_RCX,0);
          if (iVar4 != 0) goto LAB_0026e1c2;
        }
      }
      else {
LAB_0026e1c2:
        pFVar5 = FileDescriptor::dependency(file,iVar9);
        GeneratedMetadataFileName_abi_cxx11_
                  ((string *)&local_e8,(php *)pFVar5,(FileDescriptor *)0x0,(bool)is_descriptor_00);
        FilenameToClassname(&local_b8,(string *)&local_e8);
        in_RCX = &local_b8;
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,"\\^name^::initOnce();\n",(char (*) [5])0x3918cc,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (local_e8.super_Message.super_MessageLite._vptr_MessageLite !=
            (MessageLite)&local_e8._has_bits_) {
          operator_delete((void *)local_e8.super_Message.super_MessageLite._vptr_MessageLite);
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < *(int *)(file + 0x20));
  }
  FileDescriptorSet::FileDescriptorSet(&local_e8);
  if (local_e8.file_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) {
LAB_0026e265:
    internal::RepeatedPtrFieldBase::Reserve
              (&local_e8.file_.super_RepeatedPtrFieldBase,
               local_e8.file_.super_RepeatedPtrFieldBase.total_size_ + 1);
    iVar9 = (local_e8.file_.super_RepeatedPtrFieldBase.rep_)->allocated_size;
LAB_0026e278:
    (local_e8.file_.super_RepeatedPtrFieldBase.rep_)->allocated_size = iVar9 + 1;
    proto = Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>
                      (local_e8.file_.super_RepeatedPtrFieldBase.arena_);
    (local_e8.file_.super_RepeatedPtrFieldBase.rep_)->elements
    [local_e8.file_.super_RepeatedPtrFieldBase.current_size_] = proto;
  }
  else {
    iVar9 = (local_e8.file_.super_RepeatedPtrFieldBase.rep_)->allocated_size;
    if (iVar9 <= local_e8.file_.super_RepeatedPtrFieldBase.current_size_) {
      bVar15 = iVar9 == local_e8.file_.super_RepeatedPtrFieldBase.total_size_;
      local_e8.file_.super_RepeatedPtrFieldBase.total_size_ = iVar9;
      if (bVar15) goto LAB_0026e265;
      goto LAB_0026e278;
    }
    proto = (FileDescriptorProto *)
            (local_e8.file_.super_RepeatedPtrFieldBase.rep_)->elements
            [local_e8.file_.super_RepeatedPtrFieldBase.current_size_];
  }
  local_e8.file_.super_RepeatedPtrFieldBase.current_size_ =
       local_e8.file_.super_RepeatedPtrFieldBase.current_size_ + 1;
  FileDescriptor::CopyTo(file,proto);
  __n_00 = kDescriptorFile_abi_cxx11_._M_string_length;
  pRVar6 = (proto->dependency_).super_RepeatedPtrFieldBase.rep_;
  local_80 = pRVar6->elements;
  if (pRVar6 == (Rep *)0x0) {
    local_80 = (void **)0x0;
  }
  lVar10 = (long)(proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar10 != 0) {
    local_98 = &(proto->dependency_).super_RepeatedPtrFieldBase;
    local_90 = kDescriptorFile_abi_cxx11_._M_dataplus._M_p;
    uVar14 = 8;
    lVar11 = -8;
    lVar13 = 0;
    lVar12 = 0;
    local_88 = proto;
    do {
      if ((*(size_type *)((long)local_80[lVar12] + 8) != __n_00) ||
         ((__n_00 != 0 &&
          (iVar9 = bcmp(*local_80[lVar12],local_90,__n_00), proto = local_88, iVar9 != 0)))) {
        iVar4 = (int)lVar12;
        iVar9 = (int)(uVar14 >> 3);
        num = iVar9 - iVar4;
        if (0 < num) {
          uVar14 = (ulong)(uint)(iVar9 - iVar4);
          lVar10 = lVar13 >> 0x20;
          do {
            if ((proto->dependency_).super_RepeatedPtrFieldBase.arena_ == (Arena *)0x0) {
              puVar2 = (undefined8 *)
                       ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar10];
              if ((puVar2 != (undefined8 *)0x0) && ((undefined8 *)*puVar2 != puVar2 + 2)) {
                operator_delete((undefined8 *)*puVar2);
              }
              operator_delete(puVar2);
            }
            uVar14 = uVar14 - 1;
            lVar10 = lVar10 + 1;
          } while (uVar14 != 0);
          internal::RepeatedPtrFieldBase::CloseGap(local_98,iVar4,num);
        }
        break;
      }
      uVar14 = uVar14 + 8;
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x100000000;
      lVar1 = lVar10 * 8 + lVar11;
      lVar11 = lVar11 + -8;
    } while (lVar1 != 0);
  }
  lVar10 = (long)(proto->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar10) {
    pRVar6 = (proto->extension_).super_RepeatedPtrFieldBase.rep_;
    lVar13 = 0;
    do {
      FieldDescriptorProto::Clear((FieldDescriptorProto *)pRVar6->elements[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar10 != lVar13);
    (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  iVar9 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar9 != 0) {
    pRVar6 = (proto->message_type_).super_RepeatedPtrFieldBase.rep_;
    ppvVar8 = pRVar6->elements;
    if (pRVar6 == (Rep *)0x0) {
      ppvVar8 = (void **)0x0;
    }
    do {
      pvVar3 = *ppvVar8;
      iVar4 = *(int *)((long)pvVar3 + 0x80);
      if (0 < (long)iVar4) {
        lVar10 = *(long *)((long)pvVar3 + 0x88);
        lVar13 = 0;
        do {
          FieldDescriptorProto::Clear(*(FieldDescriptorProto **)(lVar10 + 8 + lVar13 * 8));
          lVar13 = lVar13 + 1;
        } while (iVar4 != lVar13);
        *(undefined4 *)((long)pvVar3 + 0x80) = 0;
        pRVar6 = (proto->message_type_).super_RepeatedPtrFieldBase.rep_;
        iVar9 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
      }
      ppvVar8 = ppvVar8 + 1;
      ppvVar7 = pRVar6->elements;
      if (pRVar6 == (Rep *)0x0) {
        ppvVar7 = (void **)0x0;
      }
    } while (ppvVar8 != ppvVar7 + iVar9);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&local_e8,&local_b8);
  io::Printer::Print<>(printer,"$pool->internalAddGeneratedFile(hex2bin(\n");
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  if (local_b8._M_string_length != 0) {
    uVar14 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_b8);
      BinaryToHex(&local_50,&local_70);
      uVar14 = uVar14 + 0x1e;
      local_78 = "";
      if (uVar14 < local_b8._M_string_length) {
        local_78 = " .";
      }
      io::Printer::Print<char[5],std::__cxx11::string,char[4],char_const*>
                (printer,"\"^data^\"^dot^\n",(char (*) [5])0x3a2885,&local_50,(char (*) [4])"dot",
                 &local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    } while (uVar14 < local_b8._M_string_length);
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"), true);\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  FileDescriptorSet::~FileDescriptorSet(&local_e8);
LAB_0026e5c0:
  io::Printer::Print<>(printer,"static::$is_initialized = true;\n");
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void GenerateAddFileToPool(const FileDescriptor* file, bool is_descriptor,
                           io::Printer* printer) {
    printer->Print(
        "public static $is_initialized = false;\n\n"
        "public static function initOnce() {\n");
    Indent(printer);

    printer->Print(
        "$pool = \\Google\\Protobuf\\Internal\\"
        "DescriptorPool::getGeneratedPool();\n\n"
        "if (static::$is_initialized == true) {\n"
        "  return;\n"
        "}\n");

  if (is_descriptor) {
    for (int i = 0; i < file->message_type_count(); i++) {
      GenerateMessageToPool("", file->message_type(i), printer);
    }
    for (int i = 0; i < file->enum_type_count(); i++) {
      GenerateEnumToPool(file->enum_type(i), printer);
    }

    printer->Print(
        "$pool->finish();\n");
  } else {
    for (int i = 0; i < file->dependency_count(); i++) {
      const std::string& name = file->dependency(i)->name();
      // Currently, descriptor.proto is not ready for external usage. Skip to
      // import it for now, so that its dependencies can still work as long as
      // they don't use protos defined in descriptor.proto.
      if (name == kDescriptorFile) {
        continue;
      }
      std::string dependency_filename =
          GeneratedMetadataFileName(file->dependency(i), is_descriptor);
      printer->Print(
          "\\^name^::initOnce();\n",
          "name", FilenameToClassname(dependency_filename));
    }

    // Add messages and enums to descriptor pool.
    FileDescriptorSet files;
    FileDescriptorProto* file_proto = files.add_file();
    file->CopyTo(file_proto);

    // Filter out descriptor.proto as it cannot be depended on for now.
    RepeatedPtrField<string>* dependency = file_proto->mutable_dependency();
    for (RepeatedPtrField<string>::iterator it = dependency->begin();
         it != dependency->end(); ++it) {
      if (*it != kDescriptorFile) {
        dependency->erase(it);
        break;
      }
    }

    // Filter out all extensions, since we do not support extension yet.
    file_proto->clear_extension();
    RepeatedPtrField<DescriptorProto>* message_type =
        file_proto->mutable_message_type();
    for (RepeatedPtrField<DescriptorProto>::iterator it = message_type->begin();
         it != message_type->end(); ++it) {
      it->clear_extension();
    }

    string files_data;
    files.SerializeToString(&files_data);

    printer->Print("$pool->internalAddGeneratedFile(hex2bin(\n");
    Indent(printer);

    // Only write 30 bytes per line.
    static const int kBytesPerLine = 30;
    for (int i = 0; i < files_data.size(); i += kBytesPerLine) {
      printer->Print(
          "\"^data^\"^dot^\n",
          "data", BinaryToHex(files_data.substr(i, kBytesPerLine)),
          "dot", i + kBytesPerLine < files_data.size() ? " ." : "");
    }

    Outdent(printer);
    printer->Print(
        "), true);\n\n");
  }
  printer->Print(
      "static::$is_initialized = true;\n");
  Outdent(printer);
  printer->Print("}\n");
}